

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* xemmai::t_module::f_execute_script
            (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
             *__return_storage_ptr__,t_object *a_code)

{
  t_global *a_library;
  t_object *a_scope;
  undefined1 local_50 [8];
  t_fields fields;
  t_object *lambda;
  t_object *a_code_local;
  
  a_library = f_global();
  a_scope = f_new<xemmai::t_scope,xemmai::t_global>(a_library);
  fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)t_lambda::f_instantiate(a_scope,a_code);
  t_fields::t_fields((t_fields *)local_50);
  t_builder::f_do<xemmai::t_module::f_execute_script(xemmai::t_object*)::__0>
            ((t_fields *)local_50,
             (anon_class_8_1_5ef94505)
             &fields.v_class.
              super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
            *)&fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  t_fields::~t_fields((t_fields *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_module::f_execute_script(t_object* a_code)
{
	auto lambda = t_lambda::f_instantiate(xemmai::f_new<t_scope>(f_global()), a_code);
	t_fields fields;
	t_builder::f_do(fields, [&](auto builder)
	{
		t_scoped_stack stack(2);
		stack[1] = builder;
		lambda->f_call_without_loop(stack, 0);
	});
	return fields.v_class;
}